

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O1

Maybe<capnp::compiler::BrandedDecl> * __thiscall
capnp::compiler::BrandedDecl::getMember
          (Maybe<capnp::compiler::BrandedDecl> *__return_storage_ptr__,BrandedDecl *this,
          StringPtr memberName,Reader subSource)

{
  long *plVar1;
  NullableValue<capnp::compiler::BrandedDecl> *pNVar2;
  OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter> *r;
  BrandedDecl local_130;
  char local_88;
  ResolveResult local_80;
  
  if ((this->body).tag == 2) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    plVar1 = *(long **)((long)&(this->body).field_1 + 0x20);
    (**(code **)(*plVar1 + 8))(&local_130,plVar1,memberName.content.ptr);
    local_88 = (char)local_130.body.tag;
    if ((char)local_130.body.tag == '\x01') {
      local_80.tag = local_130.body.field_1._0_4_;
      if (local_130.body.field_1._0_4_ == 2) {
        local_80.field_1._0_8_ = local_130.body.field_1._8_8_;
        local_80.field_1._8_8_ = local_130.body.field_1._16_8_;
      }
      else if (local_130.body.field_1._0_4_ == 1) {
        local_80.field_1._16_8_ = local_130.body.field_1._24_8_;
        local_80.field_1._24_8_ = local_130.body.field_1._32_8_;
        local_80.field_1._0_8_ = local_130.body.field_1._8_8_;
        local_80.field_1._8_8_ = local_130.body.field_1._16_8_;
        local_80.field_1.space[0x28] = local_130.body.field_1.space[0x30];
        if (local_130.body.field_1.space[0x30] == '\x01') {
          local_80.field_1._80_8_ = local_130.body.field_1._88_8_;
          local_80.field_1._88_8_ = local_130.brand.disposer;
          local_80.field_1._64_8_ = local_130.body.field_1._72_8_;
          local_80.field_1._72_8_ = local_130.body.field_1._80_8_;
          local_80.field_1._48_8_ = local_130.body.field_1._56_8_;
          local_80.field_1._56_8_ = local_130.body.field_1._64_8_;
          local_130.body.field_1.space[0x30] = '\0';
        }
      }
      if (local_130.body.field_1._0_4_ == 1) {
        local_130.body.field_1._0_4_ = 0;
      }
      if (local_130.body.field_1._0_4_ == 2) {
        local_130.body.field_1._0_4_ = 0;
      }
    }
    if ((char)local_130.body.tag == '\0') {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else {
      BrandScope::interpretResolve
                (&local_130,(this->brand).ptr,*(Resolver **)((long)&(this->body).field_1 + 0x20),
                 &local_80,subSource);
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.body.tag = local_130.body.tag;
      if (local_130.body.tag == 2) {
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
             CONCAT44(local_130.body.field_1._4_4_,local_130.body.field_1._0_4_);
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             local_130.body.field_1._8_8_;
      }
      else if (local_130.body.tag == 1) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
             local_130.body.field_1._32_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
             local_130.body.field_1._16_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
             local_130.body.field_1._24_8_;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
             CONCAT44(local_130.body.field_1._4_4_,local_130.body.field_1._0_4_);
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             local_130.body.field_1._8_8_;
        *(byte *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) =
             local_130.body.field_1.space[0x28];
        if (local_130.body.field_1.space[0x28] == '\x01') {
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) =
               local_130.body.field_1._80_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) =
               local_130.body.field_1._88_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) =
               local_130.body.field_1._64_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) =
               local_130.body.field_1._72_8_;
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
               CONCAT71(local_130.body.field_1._49_7_,local_130.body.field_1.space[0x30]);
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) =
               local_130.body.field_1._56_8_;
        }
      }
      (__return_storage_ptr__->ptr).field_1.value.brand.disposer = local_130.brand.disposer;
      (__return_storage_ptr__->ptr).field_1.value.brand.ptr = local_130.brand.ptr;
      pNVar2 = &__return_storage_ptr__->ptr;
      *(StructDataBitCount *)((long)&pNVar2->field_1 + 0x98) = local_130.source._reader.dataSize;
      *(StructPointerCount *)((long)&pNVar2->field_1 + 0x9c) = local_130.source._reader.pointerCount
      ;
      *(undefined2 *)((long)&pNVar2->field_1 + 0x9e) = local_130.source._reader._38_2_;
      *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa0) =
           local_130.source._reader.nestingLimit;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa4) =
           local_130.source._reader._44_4_;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.data =
           local_130.source._reader.data;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers =
           local_130.source._reader.pointers;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.segment =
           local_130.source._reader.segment;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
           local_130.source._reader.capTable;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<BrandedDecl> BrandedDecl::getMember(
    kj::StringPtr memberName, Expression::Reader subSource) {
  if (body.is<Resolver::ResolvedParameter>()) {
    return kj::none;
  } else KJ_IF_SOME(r, body.get<Resolver::ResolvedDecl>().resolver->resolveMember(memberName)) {
    return brand->interpretResolve(*body.get<Resolver::ResolvedDecl>().resolver, r, subSource);
  } else {
    return kj::none;
  }